

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

int av1_compute_rd_mult_based_on_qindex
              (aom_bit_depth_t bit_depth,FRAME_UPDATE_TYPE update_type,int qindex,
              aom_tune_metric tuning)

{
  int16_t iVar1;
  int iVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  char in_SIL;
  int in_EDI;
  double dVar4;
  int weight;
  double def_rd_q_mult_2;
  double def_rd_q_mult_1;
  double def_rd_q_mult;
  int64_t rdmult;
  int q;
  aom_bit_depth_t in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int local_4c;
  int local_48;
  long local_20;
  
  iVar1 = av1_dc_quant_QTX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                           in_stack_ffffffffffffffa8);
  iVar2 = (int)iVar1;
  lVar3 = (long)(iVar2 * iVar2);
  if (in_SIL == '\0') {
    dVar4 = def_kf_rd_multiplier(iVar2);
    dVar4 = (double)lVar3 * dVar4;
  }
  else if ((in_SIL == '\x02') || (in_SIL == '\x03')) {
    dVar4 = def_arf_rd_multiplier(iVar2);
    dVar4 = (double)lVar3 * dVar4;
  }
  else {
    dVar4 = def_inter_rd_multiplier(iVar2);
    dVar4 = (double)lVar3 * dVar4;
  }
  local_20 = (long)dVar4;
  if ((in_ECX == 10) || (in_ECX == 0xb)) {
    iVar2 = clamp(((0xff - in_EDX) * 3) / 4,0,0x48);
    local_20 = (long)(((double)local_20 * (double)(iVar2 + 0x80)) / 128.0);
  }
  if (in_EDI != 8) {
    if (in_EDI == 10) {
      local_20 = local_20 + 8 >> 4;
    }
    else {
      if (in_EDI != 0xc) {
        return -1;
      }
      local_20 = local_20 + 0x80 >> 8;
    }
  }
  if (local_20 < 1) {
    local_4c = 1;
  }
  else {
    if (local_20 < 0x7fffffff) {
      local_48 = (int)local_20;
    }
    else {
      local_48 = 0x7fffffff;
    }
    local_4c = local_48;
  }
  return local_4c;
}

Assistant:

int av1_compute_rd_mult_based_on_qindex(aom_bit_depth_t bit_depth,
                                        FRAME_UPDATE_TYPE update_type,
                                        int qindex, aom_tune_metric tuning) {
  const int q = av1_dc_quant_QTX(qindex, 0, bit_depth);
  int64_t rdmult = q * q;
  if (update_type == KF_UPDATE) {
    double def_rd_q_mult = def_kf_rd_multiplier(q);
    rdmult = (int64_t)((double)rdmult * def_rd_q_mult);
  } else if ((update_type == GF_UPDATE) || (update_type == ARF_UPDATE)) {
    double def_rd_q_mult = def_arf_rd_multiplier(q);
    rdmult = (int64_t)((double)rdmult * def_rd_q_mult);
  } else {
    double def_rd_q_mult = def_inter_rd_multiplier(q);
    rdmult = (int64_t)((double)rdmult * def_rd_q_mult);
  }

  if (tuning == AOM_TUNE_IQ || tuning == AOM_TUNE_SSIMULACRA2) {
    // Further multiply rdmult (by up to 200/128 = 1.5625) to improve image
    // quality. The most noticeable effect is a mild bias towards choosing
    // larger transform sizes (e.g. one 16x16 transform instead of 4 8x8
    // transforms).
    // For very high qindexes, start progressively reducing the weight towards
    // unity (128/128), as transforms are large enough and making them even
    // larger actually harms subjective quality and SSIMULACRA 2 scores.
    // This weight part of the equation was determined by iteratively increasing
    // weight on CID22 and Daala's subset1, and observing its effects on visual
    // quality and SSIMULACRA 2 scores along the usable (0-100) range.
    // The ramp-down part of the equation was determined by choosing a fixed
    // initial qindex point [qindex 159 = (255 - 159) * 3 / 4] where SSIMULACRA
    // 2 scores for encodes with qindexes greater than 159 scored at or above
    // their equivalents with no rdmult adjustment.
    const int weight = clamp(((255 - qindex) * 3) / 4, 0, 72) + 128;
    rdmult = (int64_t)((double)rdmult * weight / 128.0);
  }

  switch (bit_depth) {
    case AOM_BITS_8: break;
    case AOM_BITS_10: rdmult = ROUND_POWER_OF_TWO(rdmult, 4); break;
    case AOM_BITS_12: rdmult = ROUND_POWER_OF_TWO(rdmult, 8); break;
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
      return -1;
  }
  return rdmult > 0 ? (int)AOMMIN(rdmult, INT_MAX) : 1;
}